

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometrybasic.hpp
# Opt level: O0

bool __thiscall BasicPrimitive::intersect(BasicPrimitive *this,Ray *ray,Hit *result)

{
  void *in_RDX;
  undefined8 in_RSI;
  vec2f *in_RDI;
  bool bVar1;
  Hit *Ns;
  vec3f *Ng;
  float fVar2;
  point pVar3;
  point p;
  bool b;
  float t;
  undefined4 in_stack_ffffffffffffff3c;
  Hit *this_00;
  float in_stack_ffffffffffffff5c;
  Ray *in_stack_ffffffffffffff60;
  undefined1 local_90 [72];
  point local_48;
  undefined8 local_38;
  float local_30;
  byte local_25;
  undefined1 local_24 [4];
  void *local_20;
  
  local_20 = in_RDX;
  local_25 = (**(code **)((long)*in_RDI + 0x18))(in_RDI,in_RSI,local_24);
  local_25 = local_25 & 1;
  bVar1 = local_25 != 0;
  if (bVar1) {
    pVar3 = Ray::atParam(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    fVar2 = pVar3.z;
    local_48._0_8_ = pVar3._0_8_;
    local_38._0_4_ = local_48.x;
    local_38._4_4_ = local_48.y;
    local_48 = pVar3;
    local_30 = fVar2;
    (**(code **)((long)*in_RDI + 0x20))();
    Ns = (Hit *)(**(code **)((long)*in_RDI + 0x28))(in_RDI,&local_38);
    this_00 = Ns;
    Ng = (vec3f *)(**(code **)((long)*in_RDI + 0x30))(in_RDI,&local_38);
    Primitive::Hit::Hit(this_00,(point *)CONCAT44(in_stack_ffffffffffffff3c,fVar2),(vec3f *)Ns,Ng,
                        in_RDI);
    memcpy(local_20,local_90,0x48);
  }
  return bVar1;
}

Assistant:

bool BasicPrimitive::intersect(const Ray& ray, Hit* result) const
{
	float t;
	bool b = intersect(ray, t);
	if (!b) return false;
	point p = ray.atParam(t);
	*result = Hit(p, Ns(p), Ng(p), uv(p));
	return true;
}